

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O1

string * __thiscall
KMeans::genClusterInitialization(string *__return_storage_ptr__,KMeans *this,string *gridName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  ostream *poVar6;
  long *plVar7;
  istream *piVar8;
  undefined8 *puVar9;
  ulong uVar10;
  ulong *puVar11;
  size_type *psVar12;
  long *plVar13;
  undefined8 *puVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  string *psVar18;
  ulong uVar19;
  string line;
  string __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string __str_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  initList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream input;
  ulong *local_1550;
  long local_1548;
  ulong local_1540;
  undefined8 uStack_1538;
  string *local_1530;
  ulong *local_1528;
  long local_1520;
  ulong local_1518;
  undefined8 uStack_1510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1508;
  ulong *local_14e8;
  long local_14e0;
  ulong local_14d8;
  long lStack_14d0;
  ulong *local_14c8;
  long local_14c0;
  ulong local_14b8;
  long lStack_14b0;
  undefined8 *local_14a8;
  undefined8 local_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  ulong *local_1488;
  long local_1480;
  ulong local_1478;
  undefined8 uStack_1470;
  ulong *local_1468;
  long local_1460;
  ulong local_1458;
  undefined8 uStack_1450;
  ulong *local_1448;
  long local_1440;
  ulong local_1438;
  long lStack_1430;
  undefined8 *local_1428;
  undefined8 local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1408;
  ulong *local_13f0;
  long local_13e8;
  ulong local_13e0;
  long lStack_13d8;
  string *local_13d0;
  ulong *local_13c8;
  long local_13c0;
  ulong local_13b8;
  long lStack_13b0;
  ulong *local_13a8;
  long local_13a0;
  ulong local_1398;
  long lStack_1390;
  ulong *local_1388;
  long local_1380;
  ulong local_1378;
  long lStack_1370;
  ulong *local_1368;
  long local_1360;
  ulong local_1358;
  long lStack_1350;
  ulong *local_1348;
  long local_1340;
  ulong local_1338;
  long lStack_1330;
  ulong *local_1328;
  long local_1320;
  ulong local_1318;
  long lStack_1310;
  ulong *local_1308;
  long local_1300;
  ulong local_12f8;
  long lStack_12f0;
  ulong *local_12e8;
  long local_12e0;
  ulong local_12d8;
  long lStack_12d0;
  ulong *local_12c8;
  long local_12c0;
  ulong local_12b8;
  long lStack_12b0;
  ulong *local_12a8;
  long local_12a0;
  ulong local_1298;
  long lStack_1290;
  ulong *local_1288;
  long local_1280;
  ulong local_1278;
  long lStack_1270;
  ulong *local_1268;
  long local_1260;
  ulong local_1258;
  long lStack_1250;
  ulong *local_1248;
  long local_1240;
  ulong local_1238;
  long lStack_1230;
  ulong *local_1228;
  long local_1220;
  ulong local_1218;
  long lStack_1210;
  ulong *local_1208;
  long local_1200;
  ulong local_11f8;
  long lStack_11f0;
  ulong *local_11e8;
  long local_11e0;
  ulong local_11d8;
  long lStack_11d0;
  ulong *local_11c8;
  long local_11c0;
  ulong local_11b8;
  long lStack_11b0;
  ulong *local_11a8;
  long local_11a0;
  ulong local_1198;
  long lStack_1190;
  ulong *local_1188;
  long local_1180;
  ulong local_1178;
  long lStack_1170;
  ulong *local_1168;
  long local_1160;
  ulong local_1158;
  long lStack_1150;
  ulong *local_1148;
  long local_1140;
  ulong local_1138;
  long lStack_1130;
  ulong *local_1128;
  long local_1120;
  ulong local_1118;
  long lStack_1110;
  ulong *local_1108;
  long local_1100;
  ulong local_10f8;
  long lStack_10f0;
  ulong *local_10e8;
  long local_10e0;
  ulong local_10d8;
  long lStack_10d0;
  ulong *local_10c8;
  long local_10c0;
  ulong local_10b8;
  long lStack_10b0;
  ulong *local_10a8;
  long local_10a0;
  ulong local_1098;
  long lStack_1090;
  ulong *local_1088;
  long local_1080;
  ulong local_1078;
  long lStack_1070;
  ulong *local_1068;
  long local_1060;
  ulong local_1058;
  long lStack_1050;
  ulong *local_1048;
  long local_1040;
  ulong local_1038;
  long lStack_1030;
  ulong *local_1028;
  long local_1020;
  ulong local_1018;
  long lStack_1010;
  ulong *local_1008;
  long local_1000;
  ulong local_ff8;
  long lStack_ff0;
  ulong *local_fe8;
  long local_fe0;
  ulong local_fd8;
  long lStack_fd0;
  ulong *local_fc8;
  long local_fc0;
  ulong local_fb8;
  long lStack_fb0;
  ulong *local_fa8;
  long local_fa0;
  ulong local_f98;
  long lStack_f90;
  ulong *local_f88;
  long local_f80;
  ulong local_f78;
  long lStack_f70;
  ulong *local_f68;
  long local_f60;
  ulong local_f58;
  long lStack_f50;
  ulong *local_f48;
  long local_f40;
  ulong local_f38;
  long lStack_f30;
  ulong *local_f28;
  long local_f20;
  ulong local_f18;
  long lStack_f10;
  ulong *local_f08;
  long local_f00;
  ulong local_ef8 [2];
  ulong *local_ee8;
  long local_ee0;
  ulong local_ed8 [2];
  ulong *local_ec8;
  long local_ec0;
  ulong local_eb8 [2];
  ulong *local_ea8;
  long local_ea0;
  ulong local_e98 [2];
  ulong *local_e88;
  long local_e80;
  ulong local_e78 [2];
  ulong *local_e68;
  long local_e60;
  ulong local_e58 [2];
  ulong *local_e48;
  long local_e40;
  ulong local_e38 [2];
  ulong *local_e28;
  long local_e20;
  ulong local_e18 [2];
  ulong *local_e08;
  long local_e00;
  ulong local_df8 [2];
  ulong *local_de8;
  long local_de0;
  ulong local_dd8 [2];
  ulong *local_dc8;
  long local_dc0;
  ulong local_db8 [2];
  ulong *local_da8;
  long local_da0;
  ulong local_d98 [2];
  ulong *local_d88;
  long local_d80;
  ulong local_d78 [2];
  ulong *local_d68;
  long local_d60;
  ulong local_d58 [2];
  ulong *local_d48;
  long local_d40;
  ulong local_d38 [2];
  ulong *local_d28;
  long local_d20;
  ulong local_d18 [2];
  ulong *local_d08;
  long local_d00;
  ulong local_cf8 [2];
  ulong *local_ce8;
  long local_ce0;
  ulong local_cd8 [2];
  ulong *local_cc8;
  long local_cc0;
  ulong local_cb8 [2];
  ulong *local_ca8;
  long local_ca0;
  ulong local_c98 [2];
  ulong *local_c88;
  long local_c80;
  ulong local_c78 [2];
  ulong *local_c68;
  long local_c60;
  ulong local_c58 [2];
  ulong *local_c48;
  long local_c40;
  ulong local_c38 [2];
  ulong *local_c28;
  long local_c20;
  ulong local_c18 [2];
  ulong *local_c08;
  long local_c00;
  ulong local_bf8 [2];
  ulong *local_be8;
  long local_be0;
  ulong local_bd8 [2];
  ulong *local_bc8;
  long local_bc0;
  ulong local_bb8 [2];
  ulong *local_ba8;
  long local_ba0;
  ulong local_b98 [2];
  ulong *local_b88;
  long local_b80;
  ulong local_b78 [2];
  ulong *local_b68;
  long local_b60;
  ulong local_b58 [2];
  ulong *local_b48;
  long local_b40;
  ulong local_b38 [2];
  ulong *local_b28;
  long local_b20;
  ulong local_b18 [2];
  ulong *local_b08;
  long local_b00;
  ulong local_af8 [2];
  ulong *local_ae8;
  long local_ae0;
  ulong local_ad8 [2];
  ulong *local_ac8;
  long local_ac0;
  ulong local_ab8 [2];
  ulong *local_aa8;
  long local_aa0;
  ulong local_a98 [2];
  ulong *local_a88;
  long local_a80;
  ulong local_a78 [2];
  ulong *local_a68;
  long local_a60;
  ulong local_a58 [2];
  ulong *local_a48;
  long local_a40;
  ulong local_a38 [2];
  ulong *local_a28;
  long local_a20;
  ulong local_a18 [2];
  undefined8 *local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 *local_9e8;
  undefined8 local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 *local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 *local_9a8;
  undefined8 local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 *local_988;
  undefined8 local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 *local_948;
  undefined8 local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 *local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 *local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 *local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 *local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 *local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 *local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 *local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 *local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 *local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 *local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 *local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 *local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 *local_6c8;
  undefined8 local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 *local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 *local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 *local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 *local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 *local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 *local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 *local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  ulong *local_548;
  long local_540;
  ulong local_538 [2];
  ulong *local_528;
  long local_520;
  ulong local_518 [2];
  ulong *local_508;
  long local_500;
  ulong local_4f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e8;
  long *local_4e0;
  long local_4d8;
  long local_4d0;
  long lStack_4c8;
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  char *local_3c0;
  long local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_1408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0 = (char *)&local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,multifaq::dir::PATH_TO_FILES_abi_cxx11_,
             DAT_002db460 + multifaq::dir::PATH_TO_FILES_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_3c0);
  std::ifstream::ifstream((istream *)local_238,(string *)&local_3c0,_S_in);
  if (local_3c0 != (char *)&local_3b0) {
    operator_delete(local_3c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INFO: Looking for cluster initialization file: ",0x2f);
  local_3c0 = (char *)&local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,multifaq::dir::PATH_TO_FILES_abi_cxx11_,
             DAT_002db460 + multifaq::dir::PATH_TO_FILES_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_3c0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_3c0,local_3b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_3c0 != (char *)&local_3b0) {
    operator_delete(local_3c0);
  }
  local_1530 = __return_storage_ptr__;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_1550 = &local_1540;
    local_1548 = 0;
    local_1540 = local_1540 & 0xffffffffffffff00;
    local_13d0 = gridName;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_3c0);
    paVar1 = &local_1508.field_2;
    while( true ) {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_1550,cVar5);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      if ((char)*local_1550 != '#') {
        local_1508._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1508,local_1550,(char *)(local_1548 + (long)local_1550));
        std::__cxx11::string::append((char *)&local_1508);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1408,
                   &local_1508);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1508._M_dataplus._M_p != paVar1) {
          operator_delete(local_1508._M_dataplus._M_p);
        }
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_3c0);
    std::ios_base::~ios_base(local_340);
    if (local_1550 != &local_1540) {
      operator_delete(local_1550);
    }
    local_3c0 = (char *)&local_3b0;
    std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x06');
    psVar18 = local_1530;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    local_4e8 = &psVar18->field_2;
    (psVar18->_M_dataplus)._M_p = (pointer)local_4e8;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar12) {
      lVar3 = plVar7[3];
      local_4e8->_M_allocated_capacity = *psVar12;
      *(long *)((long)&psVar18->field_2 + 8) = lVar3;
    }
    else {
      (psVar18->_M_dataplus)._M_p = (pointer)*plVar7;
      (psVar18->field_2)._M_allocated_capacity = *psVar12;
    }
    psVar18->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_3c0 != (char *)&local_3b0) {
      operator_delete(local_3c0);
    }
    uVar10 = (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar17 = this->_k;
    uVar19 = uVar10;
    if (uVar17 < uVar10) {
      uVar19 = uVar17;
    }
    if (uVar19 != 0) {
      uVar19 = 0;
      do {
        local_14a8 = &local_1498;
        std::__cxx11::string::_M_construct((ulong)&local_14a8,'\x06');
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_14a8);
        puVar11 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar11) {
          local_14d8 = *puVar11;
          lStack_14d0 = puVar9[3];
          local_14e8 = &local_14d8;
        }
        else {
          local_14d8 = *puVar11;
          local_14e8 = (ulong *)*puVar9;
        }
        local_14e0 = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        cVar5 = '\x01';
        if (9 < uVar19) {
          uVar17 = uVar19;
          cVar4 = '\x04';
          do {
            cVar5 = cVar4;
            if (uVar17 < 100) {
              cVar5 = cVar5 + -2;
              goto LAB_001d5a0d;
            }
            if (uVar17 < 1000) {
              cVar5 = cVar5 + -1;
              goto LAB_001d5a0d;
            }
            if (uVar17 < 10000) goto LAB_001d5a0d;
            bVar2 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar4 = cVar5 + '\x04';
          } while (bVar2);
          cVar5 = cVar5 + '\x01';
        }
LAB_001d5a0d:
        local_1528 = &local_1518;
        std::__cxx11::string::_M_construct((ulong)&local_1528,cVar5);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1528,(uint)local_1520,uVar19)
        ;
        uVar17 = 0xf;
        if (local_14e8 != &local_14d8) {
          uVar17 = local_14d8;
        }
        if (uVar17 < (ulong)(local_1520 + local_14e0)) {
          uVar17 = 0xf;
          if (local_1528 != &local_1518) {
            uVar17 = local_1518;
          }
          if (uVar17 < (ulong)(local_1520 + local_14e0)) goto LAB_001d5a71;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1528,0,(char *)0x0,(ulong)local_14e8)
          ;
        }
        else {
LAB_001d5a71:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_14e8,(ulong)local_1528);
        }
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1508.field_2._M_allocated_capacity = *psVar12;
          local_1508.field_2._8_8_ = puVar9[3];
          local_1508._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1508.field_2._M_allocated_capacity = *psVar12;
          local_1508._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1508._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)psVar12 = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1508);
        local_1550 = &local_1540;
        puVar11 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar11) {
          local_1540 = *puVar11;
          uStack_1538 = puVar9[3];
        }
        else {
          local_1540 = *puVar11;
          local_1550 = (ulong *)*puVar9;
        }
        local_1548 = puVar9[1];
        *puVar9 = puVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1550,
                            (ulong)local_1408.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_dataplus.
                                   _M_p);
        local_3c0 = (char *)&local_3b0;
        pcVar15 = (char *)(puVar9 + 2);
        if ((char *)*puVar9 == pcVar15) {
          local_3b0 = *(undefined8 *)pcVar15;
          uStack_3a8 = puVar9[3];
        }
        else {
          local_3b0 = *(undefined8 *)pcVar15;
          local_3c0 = (char *)*puVar9;
        }
        local_3b8 = puVar9[1];
        *puVar9 = pcVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_1530,(ulong)local_3c0);
        if (local_3c0 != (char *)&local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_1550 != &local_1540) {
          operator_delete(local_1550);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1508._M_dataplus._M_p != paVar1) {
          operator_delete(local_1508._M_dataplus._M_p);
        }
        if (local_1528 != &local_1518) {
          operator_delete(local_1528);
        }
        if (local_14e8 != &local_14d8) {
          operator_delete(local_14e8);
        }
        if (local_14a8 != &local_1498) {
          operator_delete(local_14a8);
        }
        uVar19 = uVar19 + 1;
        uVar10 = (long)local_1408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1408.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar17 = this->_k;
        uVar16 = uVar10;
        if (uVar17 < uVar10) {
          uVar16 = uVar17;
        }
      } while (uVar19 < uVar16);
    }
    psVar18 = local_1530;
    if (uVar17 <= uVar10) goto LAB_001d62af;
    local_13f0 = &local_13e0;
    std::__cxx11::string::_M_construct((ulong)&local_13f0,'\x06');
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_13f0);
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1458 = *puVar11;
      uStack_1450 = puVar9[3];
      local_1468 = &local_1458;
    }
    else {
      local_1458 = *puVar11;
      local_1468 = (ulong *)*puVar9;
    }
    local_1460 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    uVar17 = (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1408.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    cVar5 = '\x01';
    if (9 < uVar17) {
      uVar19 = uVar17;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar19 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_001d5d6d;
        }
        if (uVar19 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_001d5d6d;
        }
        if (uVar19 < 10000) goto LAB_001d5d6d;
        bVar2 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_001d5d6d:
    local_1488 = &local_1478;
    std::__cxx11::string::_M_construct((ulong)&local_1488,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1488,(uint)local_1480,uVar17);
    uVar17 = 0xf;
    if (local_1468 != &local_1458) {
      uVar17 = local_1458;
    }
    if (uVar17 < (ulong)(local_1480 + local_1460)) {
      uVar17 = 0xf;
      if (local_1488 != &local_1478) {
        uVar17 = local_1478;
      }
      if (uVar17 < (ulong)(local_1480 + local_1460)) goto LAB_001d5df0;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1488,0,(char *)0x0,(ulong)local_1468);
    }
    else {
LAB_001d5df0:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1468,(ulong)local_1488);
    }
    local_1428 = &local_1418;
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_1418 = *puVar14;
      uStack_1410 = puVar9[3];
    }
    else {
      local_1418 = *puVar14;
      local_1428 = (undefined8 *)*puVar9;
    }
    local_1420 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1428);
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1438 = *puVar11;
      lStack_1430 = puVar9[3];
      local_1448 = &local_1438;
    }
    else {
      local_1438 = *puVar11;
      local_1448 = (ulong *)*puVar9;
    }
    local_1440 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_14c8 = &local_14b8;
    std::__cxx11::string::_M_construct((ulong)&local_14c8,'\t');
    uVar17 = 0xf;
    if (local_1448 != &local_1438) {
      uVar17 = local_1438;
    }
    if (uVar17 < (ulong)(local_14c0 + local_1440)) {
      uVar17 = 0xf;
      if (local_14c8 != &local_14b8) {
        uVar17 = local_14b8;
      }
      if (uVar17 < (ulong)(local_14c0 + local_1440)) goto LAB_001d5f4a;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_14c8,0,(char *)0x0,(ulong)local_1448);
    }
    else {
LAB_001d5f4a:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1448,(ulong)local_14c8);
    }
    local_1528 = &local_1518;
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1518 = *puVar11;
      uStack_1510 = puVar9[3];
    }
    else {
      local_1518 = *puVar11;
      local_1528 = (ulong *)*puVar9;
    }
    local_1520 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1528);
    puVar14 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar14) {
      local_1498 = *puVar14;
      uStack_1490 = puVar9[3];
      local_14a8 = &local_1498;
    }
    else {
      local_1498 = *puVar14;
      local_14a8 = (undefined8 *)*puVar9;
    }
    local_14a0 = puVar9[1];
    *puVar9 = puVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_14a8,(ulong)(local_13d0->_M_dataplus)._M_p);
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_14d8 = *puVar11;
      lStack_14d0 = puVar9[3];
      local_14e8 = &local_14d8;
    }
    else {
      local_14d8 = *puVar11;
      local_14e8 = (ulong *)*puVar9;
    }
    local_14e0 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_14e8);
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1508.field_2._M_allocated_capacity = *psVar12;
      local_1508.field_2._8_8_ = puVar9[3];
      local_1508._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1508.field_2._M_allocated_capacity = *psVar12;
      local_1508._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_1508._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_1508,(ulong)(local_13d0->_M_dataplus)._M_p);
    local_1550 = &local_1540;
    puVar11 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar11) {
      local_1540 = *puVar11;
      uStack_1538 = puVar9[3];
    }
    else {
      local_1540 = *puVar11;
      local_1550 = (ulong *)*puVar9;
    }
    local_1548 = puVar9[1];
    *puVar9 = puVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1550);
    local_3c0 = (char *)&local_3b0;
    pcVar15 = (char *)(puVar9 + 2);
    if ((char *)*puVar9 == pcVar15) {
      local_3b0 = *(undefined8 *)pcVar15;
      uStack_3a8 = puVar9[3];
    }
    else {
      local_3b0 = *(undefined8 *)pcVar15;
      local_3c0 = (char *)*puVar9;
    }
    local_3b8 = puVar9[1];
    *puVar9 = pcVar15;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_1530,(ulong)local_3c0);
    if (local_3c0 != (char *)&local_3b0) {
      operator_delete(local_3c0);
    }
    if (local_1550 != &local_1540) {
      operator_delete(local_1550);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1508._M_dataplus._M_p != paVar1) {
      operator_delete(local_1508._M_dataplus._M_p);
    }
    if (local_14e8 != &local_14d8) {
      operator_delete(local_14e8);
    }
    if (local_14a8 != &local_1498) {
      operator_delete(local_14a8);
    }
    if (local_1528 != &local_1518) {
      operator_delete(local_1528);
    }
    if (local_14c8 != &local_14b8) {
      operator_delete(local_14c8);
    }
    if (local_1448 != &local_1438) {
      operator_delete(local_1448);
    }
    if (local_1428 != &local_1418) {
      operator_delete(local_1428);
    }
    if (local_1488 != &local_1478) {
      operator_delete(local_1488);
    }
    if (local_1468 != &local_1458) {
      operator_delete(local_1468);
    }
    psVar18 = local_1530;
    if (local_13f0 != &local_13e0) {
      operator_delete(local_13f0);
    }
    goto LAB_001d62af;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INFO: No cluster initialization file provided. \n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INFO: We will use Kmeans++ Initialization instead. \n",0x34);
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct((ulong)local_3e0,'\x06');
  plVar7 = (long *)std::__cxx11::string::append((char *)local_3e0);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_13b8 = *puVar11;
    lStack_13b0 = plVar7[3];
    local_13c8 = &local_13b8;
  }
  else {
    local_13b8 = *puVar11;
    local_13c8 = (ulong *)*plVar7;
  }
  local_13c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a28 = local_a18;
  std::__cxx11::string::_M_construct((ulong)&local_a28,'\x06');
  uVar17 = 0xf;
  if (local_13c8 != &local_13b8) {
    uVar17 = local_13b8;
  }
  if (uVar17 < (ulong)(local_a20 + local_13c0)) {
    uVar17 = 0xf;
    if (local_a28 != local_a18) {
      uVar17 = local_a18[0];
    }
    if (uVar17 < (ulong)(local_a20 + local_13c0)) goto LAB_001d0f93;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a28,0,(char *)0x0,(ulong)local_13c8);
  }
  else {
LAB_001d0f93:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_13c8,(ulong)local_a28);
  }
  local_a08 = &local_9f8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_9f8 = *puVar14;
    uStack_9f0 = puVar9[3];
  }
  else {
    local_9f8 = *puVar14;
    local_a08 = (undefined8 *)*puVar9;
  }
  local_a00 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a08);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1398 = *puVar11;
    lStack_1390 = plVar7[3];
    local_13a8 = &local_1398;
  }
  else {
    local_1398 = *puVar11;
    local_13a8 = (ulong *)*plVar7;
  }
  local_13a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a48 = local_a38;
  std::__cxx11::string::_M_construct((ulong)&local_a48,'\x06');
  uVar17 = 0xf;
  if (local_13a8 != &local_1398) {
    uVar17 = local_1398;
  }
  if (uVar17 < (ulong)(local_a40 + local_13a0)) {
    uVar17 = 0xf;
    if (local_a48 != local_a38) {
      uVar17 = local_a38[0];
    }
    if (uVar17 < (ulong)(local_a40 + local_13a0)) goto LAB_001d10e5;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a48,0,(char *)0x0,(ulong)local_13a8);
  }
  else {
LAB_001d10e5:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_13a8,(ulong)local_a48);
  }
  local_9e8 = &local_9d8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_9d8 = *puVar14;
    uStack_9d0 = puVar9[3];
  }
  else {
    local_9d8 = *puVar14;
    local_9e8 = (undefined8 *)*puVar9;
  }
  local_9e0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_9e8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1378 = *puVar11;
    lStack_1370 = plVar7[3];
    local_1388 = &local_1378;
  }
  else {
    local_1378 = *puVar11;
    local_1388 = (ulong *)*plVar7;
  }
  local_1380 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a68 = local_a58;
  std::__cxx11::string::_M_construct((ulong)&local_a68,'\x06');
  uVar17 = 0xf;
  if (local_1388 != &local_1378) {
    uVar17 = local_1378;
  }
  if (uVar17 < (ulong)(local_a60 + local_1380)) {
    uVar17 = 0xf;
    if (local_a68 != local_a58) {
      uVar17 = local_a58[0];
    }
    if (uVar17 < (ulong)(local_a60 + local_1380)) goto LAB_001d1237;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a68,0,(char *)0x0,(ulong)local_1388);
  }
  else {
LAB_001d1237:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1388,(ulong)local_a68);
  }
  local_9c8 = &local_9b8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_9b8 = *puVar14;
    uStack_9b0 = puVar9[3];
  }
  else {
    local_9b8 = *puVar14;
    local_9c8 = (undefined8 *)*puVar9;
  }
  local_9c0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_9c8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1358 = *puVar11;
    lStack_1350 = plVar7[3];
    local_1368 = &local_1358;
  }
  else {
    local_1358 = *puVar11;
    local_1368 = (ulong *)*plVar7;
  }
  local_1360 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_a88 = local_a78;
  std::__cxx11::string::_M_construct((ulong)&local_a88,'\x06');
  uVar17 = 0xf;
  if (local_1368 != &local_1358) {
    uVar17 = local_1358;
  }
  if (uVar17 < (ulong)(local_a80 + local_1360)) {
    uVar17 = 0xf;
    if (local_a88 != local_a78) {
      uVar17 = local_a78[0];
    }
    if (uVar17 < (ulong)(local_a80 + local_1360)) goto LAB_001d1389;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a88,0,(char *)0x0,(ulong)local_1368);
  }
  else {
LAB_001d1389:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1368,(ulong)local_a88);
  }
  local_9a8 = &local_998;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_998 = *puVar14;
    uStack_990 = puVar9[3];
  }
  else {
    local_998 = *puVar14;
    local_9a8 = (undefined8 *)*puVar9;
  }
  local_9a0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_9a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1338 = *puVar11;
    lStack_1330 = plVar7[3];
    local_1348 = &local_1338;
  }
  else {
    local_1338 = *puVar11;
    local_1348 = (ulong *)*plVar7;
  }
  local_1340 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_aa8 = local_a98;
  std::__cxx11::string::_M_construct((ulong)&local_aa8,'\x06');
  uVar17 = 0xf;
  if (local_1348 != &local_1338) {
    uVar17 = local_1338;
  }
  if (uVar17 < (ulong)(local_aa0 + local_1340)) {
    uVar17 = 0xf;
    if (local_aa8 != local_a98) {
      uVar17 = local_a98[0];
    }
    if (uVar17 < (ulong)(local_aa0 + local_1340)) goto LAB_001d14db;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_aa8,0,(char *)0x0,(ulong)local_1348);
  }
  else {
LAB_001d14db:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1348,(ulong)local_aa8);
  }
  local_988 = &local_978;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_978 = *puVar14;
    uStack_970 = puVar9[3];
  }
  else {
    local_978 = *puVar14;
    local_988 = (undefined8 *)*puVar9;
  }
  local_980 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_988);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1318 = *puVar11;
    lStack_1310 = plVar7[3];
    local_1328 = &local_1318;
  }
  else {
    local_1318 = *puVar11;
    local_1328 = (ulong *)*plVar7;
  }
  local_1320 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ac8 = local_ab8;
  std::__cxx11::string::_M_construct((ulong)&local_ac8,'\x06');
  uVar17 = 0xf;
  if (local_1328 != &local_1318) {
    uVar17 = local_1318;
  }
  if (uVar17 < (ulong)(local_ac0 + local_1320)) {
    uVar17 = 0xf;
    if (local_ac8 != local_ab8) {
      uVar17 = local_ab8[0];
    }
    if (uVar17 < (ulong)(local_ac0 + local_1320)) goto LAB_001d162d;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ac8,0,(char *)0x0,(ulong)local_1328);
  }
  else {
LAB_001d162d:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1328,(ulong)local_ac8);
  }
  local_968 = &local_958;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_958 = *puVar14;
    uStack_950 = puVar9[3];
  }
  else {
    local_958 = *puVar14;
    local_968 = (undefined8 *)*puVar9;
  }
  local_960 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_968);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_12f8 = *puVar11;
    lStack_12f0 = plVar7[3];
    local_1308 = &local_12f8;
  }
  else {
    local_12f8 = *puVar11;
    local_1308 = (ulong *)*plVar7;
  }
  local_1300 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ae8 = local_ad8;
  std::__cxx11::string::_M_construct((ulong)&local_ae8,'\t');
  uVar17 = 0xf;
  if (local_1308 != &local_12f8) {
    uVar17 = local_12f8;
  }
  if (uVar17 < (ulong)(local_ae0 + local_1300)) {
    uVar17 = 0xf;
    if (local_ae8 != local_ad8) {
      uVar17 = local_ad8[0];
    }
    if (uVar17 < (ulong)(local_ae0 + local_1300)) goto LAB_001d177f;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ae8,0,(char *)0x0,(ulong)local_1308);
  }
  else {
LAB_001d177f:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1308,(ulong)local_ae8);
  }
  local_948 = &local_938;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_938 = *puVar14;
    uStack_930 = puVar9[3];
  }
  else {
    local_938 = *puVar14;
    local_948 = (undefined8 *)*puVar9;
  }
  local_940 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_948);
  local_4e0 = &local_4d0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_4d0 = *plVar13;
    lStack_4c8 = plVar7[3];
  }
  else {
    local_4d0 = *plVar13;
    local_4e0 = (long *)*plVar7;
  }
  local_4d8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4e0,(ulong)(gridName->_M_dataplus)._M_p);
  local_4c0 = &local_4b0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_4b0 = *plVar13;
    lStack_4a8 = plVar7[3];
  }
  else {
    local_4b0 = *plVar13;
    local_4c0 = (long *)*plVar7;
  }
  local_4b8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_12d8 = *puVar11;
    lStack_12d0 = plVar7[3];
    local_12e8 = &local_12d8;
  }
  else {
    local_12d8 = *puVar11;
    local_12e8 = (ulong *)*plVar7;
  }
  local_12e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b08 = local_af8;
  std::__cxx11::string::_M_construct((ulong)&local_b08,'\t');
  uVar17 = 0xf;
  if (local_12e8 != &local_12d8) {
    uVar17 = local_12d8;
  }
  if (uVar17 < (ulong)(local_b00 + local_12e0)) {
    uVar17 = 0xf;
    if (local_b08 != local_af8) {
      uVar17 = local_af8[0];
    }
    if (uVar17 < (ulong)(local_b00 + local_12e0)) goto LAB_001d1994;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b08,0,(char *)0x0,(ulong)local_12e8);
  }
  else {
LAB_001d1994:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_12e8,(ulong)local_b08);
  }
  local_928 = &local_918;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_918 = *puVar14;
    uStack_910 = puVar9[3];
  }
  else {
    local_918 = *puVar14;
    local_928 = (undefined8 *)*puVar9;
  }
  local_920 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_928);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_12b8 = *puVar11;
    lStack_12b0 = plVar7[3];
    local_12c8 = &local_12b8;
  }
  else {
    local_12b8 = *puVar11;
    local_12c8 = (ulong *)*plVar7;
  }
  local_12c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b28 = local_b18;
  std::__cxx11::string::_M_construct((ulong)&local_b28,'\x06');
  uVar17 = 0xf;
  if (local_12c8 != &local_12b8) {
    uVar17 = local_12b8;
  }
  if (uVar17 < (ulong)(local_b20 + local_12c0)) {
    uVar17 = 0xf;
    if (local_b28 != local_b18) {
      uVar17 = local_b18[0];
    }
    if (uVar17 < (ulong)(local_b20 + local_12c0)) goto LAB_001d1ae6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b28,0,(char *)0x0,(ulong)local_12c8);
  }
  else {
LAB_001d1ae6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_12c8,(ulong)local_b28);
  }
  local_908 = &local_8f8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_8f8 = *puVar14;
    uStack_8f0 = puVar9[3];
  }
  else {
    local_8f8 = *puVar14;
    local_908 = (undefined8 *)*puVar9;
  }
  local_900 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_908);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1298 = *puVar11;
    lStack_1290 = plVar7[3];
    local_12a8 = &local_1298;
  }
  else {
    local_1298 = *puVar11;
    local_12a8 = (ulong *)*plVar7;
  }
  local_12a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b48 = local_b38;
  std::__cxx11::string::_M_construct((ulong)&local_b48,'\x06');
  uVar17 = 0xf;
  if (local_12a8 != &local_1298) {
    uVar17 = local_1298;
  }
  if (uVar17 < (ulong)(local_b40 + local_12a0)) {
    uVar17 = 0xf;
    if (local_b48 != local_b38) {
      uVar17 = local_b38[0];
    }
    if (uVar17 < (ulong)(local_b40 + local_12a0)) goto LAB_001d1c38;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b48,0,(char *)0x0,(ulong)local_12a8);
  }
  else {
LAB_001d1c38:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_12a8,(ulong)local_b48);
  }
  local_8e8 = &local_8d8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_8d8 = *puVar14;
    uStack_8d0 = puVar9[3];
  }
  else {
    local_8d8 = *puVar14;
    local_8e8 = (undefined8 *)*puVar9;
  }
  local_8e0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8e8);
  local_4a0 = &local_490;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_490 = *plVar13;
    lStack_488 = plVar7[3];
  }
  else {
    local_490 = *plVar13;
    local_4a0 = (long *)*plVar7;
  }
  local_498 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4a0,(ulong)(gridName->_M_dataplus)._M_p);
  local_480 = &local_470;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_470 = *plVar13;
    lStack_468 = plVar7[3];
  }
  else {
    local_470 = *plVar13;
    local_480 = (long *)*plVar7;
  }
  local_478 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_480);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1278 = *puVar11;
    lStack_1270 = plVar7[3];
    local_1288 = &local_1278;
  }
  else {
    local_1278 = *puVar11;
    local_1288 = (ulong *)*plVar7;
  }
  local_1280 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b68 = local_b58;
  std::__cxx11::string::_M_construct((ulong)&local_b68,'\x06');
  uVar17 = 0xf;
  if (local_1288 != &local_1278) {
    uVar17 = local_1278;
  }
  if (uVar17 < (ulong)(local_b60 + local_1280)) {
    uVar17 = 0xf;
    if (local_b68 != local_b58) {
      uVar17 = local_b58[0];
    }
    if (uVar17 < (ulong)(local_b60 + local_1280)) goto LAB_001d1e4d;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b68,0,(char *)0x0,(ulong)local_1288);
  }
  else {
LAB_001d1e4d:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1288,(ulong)local_b68);
  }
  local_8c8 = &local_8b8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_8b8 = *puVar14;
    uStack_8b0 = puVar9[3];
  }
  else {
    local_8b8 = *puVar14;
    local_8c8 = (undefined8 *)*puVar9;
  }
  local_8c0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1258 = *puVar11;
    lStack_1250 = plVar7[3];
    local_1268 = &local_1258;
  }
  else {
    local_1258 = *puVar11;
    local_1268 = (ulong *)*plVar7;
  }
  local_1260 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b88 = local_b78;
  std::__cxx11::string::_M_construct((ulong)&local_b88,'\x06');
  uVar17 = 0xf;
  if (local_1268 != &local_1258) {
    uVar17 = local_1258;
  }
  if (uVar17 < (ulong)(local_b80 + local_1260)) {
    uVar17 = 0xf;
    if (local_b88 != local_b78) {
      uVar17 = local_b78[0];
    }
    if (uVar17 < (ulong)(local_b80 + local_1260)) goto LAB_001d1f9f;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b88,0,(char *)0x0,(ulong)local_1268);
  }
  else {
LAB_001d1f9f:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1268,(ulong)local_b88);
  }
  local_8a8 = &local_898;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_898 = *puVar14;
    uStack_890 = puVar9[3];
  }
  else {
    local_898 = *puVar14;
    local_8a8 = (undefined8 *)*puVar9;
  }
  local_8a0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1238 = *puVar11;
    lStack_1230 = plVar7[3];
    local_1248 = &local_1238;
  }
  else {
    local_1238 = *puVar11;
    local_1248 = (ulong *)*plVar7;
  }
  local_1240 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ba8 = local_b98;
  std::__cxx11::string::_M_construct((ulong)&local_ba8,'\x06');
  uVar17 = 0xf;
  if (local_1248 != &local_1238) {
    uVar17 = local_1238;
  }
  if (uVar17 < (ulong)(local_ba0 + local_1240)) {
    uVar17 = 0xf;
    if (local_ba8 != local_b98) {
      uVar17 = local_b98[0];
    }
    if (uVar17 < (ulong)(local_ba0 + local_1240)) goto LAB_001d20f1;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ba8,0,(char *)0x0,(ulong)local_1248);
  }
  else {
LAB_001d20f1:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1248,(ulong)local_ba8);
  }
  local_888 = &local_878;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_878 = *puVar14;
    uStack_870 = puVar9[3];
  }
  else {
    local_878 = *puVar14;
    local_888 = (undefined8 *)*puVar9;
  }
  local_880 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_888);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1218 = *puVar11;
    lStack_1210 = plVar7[3];
    local_1228 = &local_1218;
  }
  else {
    local_1218 = *puVar11;
    local_1228 = (ulong *)*plVar7;
  }
  local_1220 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_bc8 = local_bb8;
  std::__cxx11::string::_M_construct((ulong)&local_bc8,'\t');
  uVar17 = 0xf;
  if (local_1228 != &local_1218) {
    uVar17 = local_1218;
  }
  if (uVar17 < (ulong)(local_bc0 + local_1220)) {
    uVar17 = 0xf;
    if (local_bc8 != local_bb8) {
      uVar17 = local_bb8[0];
    }
    if (uVar17 < (ulong)(local_bc0 + local_1220)) goto LAB_001d2243;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_bc8,0,(char *)0x0,(ulong)local_1228);
  }
  else {
LAB_001d2243:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1228,(ulong)local_bc8);
  }
  local_868 = &local_858;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_858 = *puVar14;
    uStack_850 = puVar9[3];
  }
  else {
    local_858 = *puVar14;
    local_868 = (undefined8 *)*puVar9;
  }
  local_860 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_868);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_11f8 = *puVar11;
    lStack_11f0 = plVar7[3];
    local_1208 = &local_11f8;
  }
  else {
    local_11f8 = *puVar11;
    local_1208 = (ulong *)*plVar7;
  }
  local_1200 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_be8 = local_bd8;
  std::__cxx11::string::_M_construct((ulong)&local_be8,'\t');
  uVar17 = 0xf;
  if (local_1208 != &local_11f8) {
    uVar17 = local_11f8;
  }
  if (uVar17 < (ulong)(local_be0 + local_1200)) {
    uVar17 = 0xf;
    if (local_be8 != local_bd8) {
      uVar17 = local_bd8[0];
    }
    if (uVar17 < (ulong)(local_be0 + local_1200)) goto LAB_001d2395;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_be8,0,(char *)0x0,(ulong)local_1208);
  }
  else {
LAB_001d2395:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1208,(ulong)local_be8);
  }
  local_848 = &local_838;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_838 = *puVar14;
    uStack_830 = puVar9[3];
  }
  else {
    local_838 = *puVar14;
    local_848 = (undefined8 *)*puVar9;
  }
  local_840 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_848);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_11d8 = *puVar11;
    lStack_11d0 = plVar7[3];
    local_11e8 = &local_11d8;
  }
  else {
    local_11d8 = *puVar11;
    local_11e8 = (ulong *)*plVar7;
  }
  local_11e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c08 = local_bf8;
  std::__cxx11::string::_M_construct((ulong)&local_c08,'\t');
  uVar17 = 0xf;
  if (local_11e8 != &local_11d8) {
    uVar17 = local_11d8;
  }
  if (uVar17 < (ulong)(local_c00 + local_11e0)) {
    uVar17 = 0xf;
    if (local_c08 != local_bf8) {
      uVar17 = local_bf8[0];
    }
    if (uVar17 < (ulong)(local_c00 + local_11e0)) goto LAB_001d24e7;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c08,0,(char *)0x0,(ulong)local_11e8);
  }
  else {
LAB_001d24e7:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_11e8,(ulong)local_c08);
  }
  local_828 = &local_818;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_818 = *puVar14;
    uStack_810 = puVar9[3];
  }
  else {
    local_818 = *puVar14;
    local_828 = (undefined8 *)*puVar9;
  }
  local_820 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_828);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_11b8 = *puVar11;
    lStack_11b0 = plVar7[3];
    local_11c8 = &local_11b8;
  }
  else {
    local_11b8 = *puVar11;
    local_11c8 = (ulong *)*plVar7;
  }
  local_11c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c28 = local_c18;
  std::__cxx11::string::_M_construct((ulong)&local_c28,'\t');
  uVar17 = 0xf;
  if (local_11c8 != &local_11b8) {
    uVar17 = local_11b8;
  }
  if (uVar17 < (ulong)(local_c20 + local_11c0)) {
    uVar17 = 0xf;
    if (local_c28 != local_c18) {
      uVar17 = local_c18[0];
    }
    if (uVar17 < (ulong)(local_c20 + local_11c0)) goto LAB_001d2639;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c28,0,(char *)0x0,(ulong)local_11c8);
  }
  else {
LAB_001d2639:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_11c8,(ulong)local_c28);
  }
  local_808 = &local_7f8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_7f8 = *puVar14;
    uStack_7f0 = puVar9[3];
  }
  else {
    local_7f8 = *puVar14;
    local_808 = (undefined8 *)*puVar9;
  }
  local_800 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_808);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1198 = *puVar11;
    lStack_1190 = plVar7[3];
    local_11a8 = &local_1198;
  }
  else {
    local_1198 = *puVar11;
    local_11a8 = (ulong *)*plVar7;
  }
  local_11a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c48 = local_c38;
  std::__cxx11::string::_M_construct((ulong)&local_c48,'\t');
  uVar17 = 0xf;
  if (local_11a8 != &local_1198) {
    uVar17 = local_1198;
  }
  if (uVar17 < (ulong)(local_c40 + local_11a0)) {
    uVar17 = 0xf;
    if (local_c48 != local_c38) {
      uVar17 = local_c38[0];
    }
    if (uVar17 < (ulong)(local_c40 + local_11a0)) goto LAB_001d278b;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c48,0,(char *)0x0,(ulong)local_11a8);
  }
  else {
LAB_001d278b:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_11a8,(ulong)local_c48);
  }
  local_7e8 = &local_7d8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_7d8 = *puVar14;
    uStack_7d0 = puVar9[3];
  }
  else {
    local_7d8 = *puVar14;
    local_7e8 = (undefined8 *)*puVar9;
  }
  local_7e0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_7e8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1178 = *puVar11;
    lStack_1170 = plVar7[3];
    local_1188 = &local_1178;
  }
  else {
    local_1178 = *puVar11;
    local_1188 = (ulong *)*plVar7;
  }
  local_1180 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c68 = local_c58;
  std::__cxx11::string::_M_construct((ulong)&local_c68,'\f');
  uVar17 = 0xf;
  if (local_1188 != &local_1178) {
    uVar17 = local_1178;
  }
  if (uVar17 < (ulong)(local_c60 + local_1180)) {
    uVar17 = 0xf;
    if (local_c68 != local_c58) {
      uVar17 = local_c58[0];
    }
    if (uVar17 < (ulong)(local_c60 + local_1180)) goto LAB_001d28dd;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c68,0,(char *)0x0,(ulong)local_1188);
  }
  else {
LAB_001d28dd:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1188,(ulong)local_c68);
  }
  local_7c8 = &local_7b8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_7b8 = *puVar14;
    uStack_7b0 = puVar9[3];
  }
  else {
    local_7b8 = *puVar14;
    local_7c8 = (undefined8 *)*puVar9;
  }
  local_7c0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_7c8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1158 = *puVar11;
    lStack_1150 = plVar7[3];
    local_1168 = &local_1158;
  }
  else {
    local_1158 = *puVar11;
    local_1168 = (ulong *)*plVar7;
  }
  local_1160 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c88 = local_c78;
  std::__cxx11::string::_M_construct((ulong)&local_c88,'\f');
  uVar17 = 0xf;
  if (local_1168 != &local_1158) {
    uVar17 = local_1158;
  }
  if (uVar17 < (ulong)(local_c80 + local_1160)) {
    uVar17 = 0xf;
    if (local_c88 != local_c78) {
      uVar17 = local_c78[0];
    }
    if (uVar17 < (ulong)(local_c80 + local_1160)) goto LAB_001d2a2f;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c88,0,(char *)0x0,(ulong)local_1168);
  }
  else {
LAB_001d2a2f:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1168,(ulong)local_c88);
  }
  local_7a8 = &local_798;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_798 = *puVar14;
    uStack_790 = puVar9[3];
  }
  else {
    local_798 = *puVar14;
    local_7a8 = (undefined8 *)*puVar9;
  }
  local_7a0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_7a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1138 = *puVar11;
    lStack_1130 = plVar7[3];
    local_1148 = &local_1138;
  }
  else {
    local_1138 = *puVar11;
    local_1148 = (ulong *)*plVar7;
  }
  local_1140 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ca8 = local_c98;
  std::__cxx11::string::_M_construct((ulong)&local_ca8,'\f');
  uVar17 = 0xf;
  if (local_1148 != &local_1138) {
    uVar17 = local_1138;
  }
  if (uVar17 < (ulong)(local_ca0 + local_1140)) {
    uVar17 = 0xf;
    if (local_ca8 != local_c98) {
      uVar17 = local_c98[0];
    }
    if (uVar17 < (ulong)(local_ca0 + local_1140)) goto LAB_001d2b81;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ca8,0,(char *)0x0,(ulong)local_1148);
  }
  else {
LAB_001d2b81:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1148,(ulong)local_ca8);
  }
  local_788 = &local_778;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_778 = *puVar14;
    uStack_770 = puVar9[3];
  }
  else {
    local_778 = *puVar14;
    local_788 = (undefined8 *)*puVar9;
  }
  local_780 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_788);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1118 = *puVar11;
    lStack_1110 = plVar7[3];
    local_1128 = &local_1118;
  }
  else {
    local_1118 = *puVar11;
    local_1128 = (ulong *)*plVar7;
  }
  local_1120 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_cc8 = local_cb8;
  std::__cxx11::string::_M_construct((ulong)&local_cc8,'\x0f');
  uVar17 = 0xf;
  if (local_1128 != &local_1118) {
    uVar17 = local_1118;
  }
  if (uVar17 < (ulong)(local_cc0 + local_1120)) {
    uVar17 = 0xf;
    if (local_cc8 != local_cb8) {
      uVar17 = local_cb8[0];
    }
    if (uVar17 < (ulong)(local_cc0 + local_1120)) goto LAB_001d2cd4;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_cc8,0,(char *)0x0,(ulong)local_1128);
  }
  else {
LAB_001d2cd4:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1128,(ulong)local_cc8);
  }
  local_768 = &local_758;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_758 = *puVar14;
    uStack_750 = puVar9[3];
  }
  else {
    local_758 = *puVar14;
    local_768 = (undefined8 *)*puVar9;
  }
  local_760 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_768);
  local_460 = &local_450;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_450 = *plVar13;
    lStack_448 = plVar7[3];
  }
  else {
    local_450 = *plVar13;
    local_460 = (long *)*plVar7;
  }
  local_458 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_460,(ulong)(gridName->_M_dataplus)._M_p);
  local_440 = &local_430;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_430 = *plVar13;
    lStack_428 = plVar7[3];
  }
  else {
    local_430 = *plVar13;
    local_440 = (long *)*plVar7;
  }
  local_438 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_440);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_10f8 = *puVar11;
    lStack_10f0 = plVar7[3];
    local_1108 = &local_10f8;
  }
  else {
    local_10f8 = *puVar11;
    local_1108 = (ulong *)*plVar7;
  }
  local_1100 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ce8 = local_cd8;
  std::__cxx11::string::_M_construct((ulong)&local_ce8,'\x0f');
  uVar17 = 0xf;
  if (local_1108 != &local_10f8) {
    uVar17 = local_10f8;
  }
  if (uVar17 < (ulong)(local_ce0 + local_1100)) {
    uVar17 = 0xf;
    if (local_ce8 != local_cd8) {
      uVar17 = local_cd8[0];
    }
    if (uVar17 < (ulong)(local_ce0 + local_1100)) goto LAB_001d2eea;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ce8,0,(char *)0x0,(ulong)local_1108);
  }
  else {
LAB_001d2eea:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1108,(ulong)local_ce8);
  }
  local_748 = &local_738;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_738 = *puVar14;
    uStack_730 = puVar9[3];
  }
  else {
    local_738 = *puVar14;
    local_748 = (undefined8 *)*puVar9;
  }
  local_740 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_748);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_10d8 = *puVar11;
    lStack_10d0 = plVar7[3];
    local_10e8 = &local_10d8;
  }
  else {
    local_10d8 = *puVar11;
    local_10e8 = (ulong *)*plVar7;
  }
  local_10e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d08 = local_cf8;
  std::__cxx11::string::_M_construct((ulong)&local_d08,'\f');
  uVar17 = 0xf;
  if (local_10e8 != &local_10d8) {
    uVar17 = local_10d8;
  }
  if (uVar17 < (ulong)(local_d00 + local_10e0)) {
    uVar17 = 0xf;
    if (local_d08 != local_cf8) {
      uVar17 = local_cf8[0];
    }
    if (uVar17 < (ulong)(local_d00 + local_10e0)) goto LAB_001d303c;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d08,0,(char *)0x0,(ulong)local_10e8);
  }
  else {
LAB_001d303c:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_10e8,(ulong)local_d08);
  }
  local_728 = &local_718;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_718 = *puVar14;
    uStack_710 = puVar9[3];
  }
  else {
    local_718 = *puVar14;
    local_728 = (undefined8 *)*puVar9;
  }
  local_720 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_728);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_10b8 = *puVar11;
    lStack_10b0 = plVar7[3];
    local_10c8 = &local_10b8;
  }
  else {
    local_10b8 = *puVar11;
    local_10c8 = (ulong *)*plVar7;
  }
  local_10c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d28 = local_d18;
  std::__cxx11::string::_M_construct((ulong)&local_d28,'\f');
  uVar17 = 0xf;
  if (local_10c8 != &local_10b8) {
    uVar17 = local_10b8;
  }
  if (uVar17 < (ulong)(local_d20 + local_10c0)) {
    uVar17 = 0xf;
    if (local_d28 != local_d18) {
      uVar17 = local_d18[0];
    }
    if (uVar17 < (ulong)(local_d20 + local_10c0)) goto LAB_001d318e;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d28,0,(char *)0x0,(ulong)local_10c8);
  }
  else {
LAB_001d318e:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_10c8,(ulong)local_d28);
  }
  local_708 = &local_6f8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_6f8 = *puVar14;
    uStack_6f0 = puVar9[3];
  }
  else {
    local_6f8 = *puVar14;
    local_708 = (undefined8 *)*puVar9;
  }
  local_700 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_708);
  local_420 = &local_410;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_410 = *plVar13;
    lStack_408 = plVar7[3];
  }
  else {
    local_410 = *plVar13;
    local_420 = (long *)*plVar7;
  }
  local_418 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_420,(ulong)(gridName->_M_dataplus)._M_p);
  local_400 = &local_3f0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_3f0 = *plVar13;
    lStack_3e8 = plVar7[3];
  }
  else {
    local_3f0 = *plVar13;
    local_400 = (long *)*plVar7;
  }
  local_3f8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_400);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1098 = *puVar11;
    lStack_1090 = plVar7[3];
    local_10a8 = &local_1098;
  }
  else {
    local_1098 = *puVar11;
    local_10a8 = (ulong *)*plVar7;
  }
  local_10a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d48 = local_d38;
  std::__cxx11::string::_M_construct((ulong)&local_d48,'\f');
  uVar17 = 0xf;
  if (local_10a8 != &local_1098) {
    uVar17 = local_1098;
  }
  if (uVar17 < (ulong)(local_d40 + local_10a0)) {
    uVar17 = 0xf;
    if (local_d48 != local_d38) {
      uVar17 = local_d38[0];
    }
    if (uVar17 < (ulong)(local_d40 + local_10a0)) goto LAB_001d33a3;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d48,0,(char *)0x0,(ulong)local_10a8);
  }
  else {
LAB_001d33a3:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_10a8,(ulong)local_d48);
  }
  local_6e8 = &local_6d8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_6d8 = *puVar14;
    uStack_6d0 = puVar9[3];
  }
  else {
    local_6d8 = *puVar14;
    local_6e8 = (undefined8 *)*puVar9;
  }
  local_6e0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_6e8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1078 = *puVar11;
    lStack_1070 = plVar7[3];
    local_1088 = &local_1078;
  }
  else {
    local_1078 = *puVar11;
    local_1088 = (ulong *)*plVar7;
  }
  local_1080 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d68 = local_d58;
  std::__cxx11::string::_M_construct((ulong)&local_d68,'\f');
  uVar17 = 0xf;
  if (local_1088 != &local_1078) {
    uVar17 = local_1078;
  }
  if (uVar17 < (ulong)(local_d60 + local_1080)) {
    uVar17 = 0xf;
    if (local_d68 != local_d58) {
      uVar17 = local_d58[0];
    }
    if (uVar17 < (ulong)(local_d60 + local_1080)) goto LAB_001d34f5;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d68,0,(char *)0x0,(ulong)local_1088);
  }
  else {
LAB_001d34f5:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1088,(ulong)local_d68);
  }
  local_6c8 = &local_6b8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_6b8 = *puVar14;
    uStack_6b0 = puVar9[3];
  }
  else {
    local_6b8 = *puVar14;
    local_6c8 = (undefined8 *)*puVar9;
  }
  local_6c0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_6c8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1058 = *puVar11;
    lStack_1050 = plVar7[3];
    local_1068 = &local_1058;
  }
  else {
    local_1058 = *puVar11;
    local_1068 = (ulong *)*plVar7;
  }
  local_1060 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d88 = local_d78;
  std::__cxx11::string::_M_construct((ulong)&local_d88,'\t');
  uVar17 = 0xf;
  if (local_1068 != &local_1058) {
    uVar17 = local_1058;
  }
  if (uVar17 < (ulong)(local_d80 + local_1060)) {
    uVar17 = 0xf;
    if (local_d88 != local_d78) {
      uVar17 = local_d78[0];
    }
    if (uVar17 < (ulong)(local_d80 + local_1060)) goto LAB_001d3647;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d88,0,(char *)0x0,(ulong)local_1068);
  }
  else {
LAB_001d3647:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1068,(ulong)local_d88);
  }
  local_6a8 = &local_698;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_698 = *puVar14;
    uStack_690 = puVar9[3];
  }
  else {
    local_698 = *puVar14;
    local_6a8 = (undefined8 *)*puVar9;
  }
  local_6a0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_6a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1038 = *puVar11;
    lStack_1030 = plVar7[3];
    local_1048 = &local_1038;
  }
  else {
    local_1038 = *puVar11;
    local_1048 = (ulong *)*plVar7;
  }
  local_1040 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_da8 = local_d98;
  std::__cxx11::string::_M_construct((ulong)&local_da8,'\t');
  uVar17 = 0xf;
  if (local_1048 != &local_1038) {
    uVar17 = local_1038;
  }
  if (uVar17 < (ulong)(local_da0 + local_1040)) {
    uVar17 = 0xf;
    if (local_da8 != local_d98) {
      uVar17 = local_d98[0];
    }
    if (uVar17 < (ulong)(local_da0 + local_1040)) goto LAB_001d3799;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_da8,0,(char *)0x0,(ulong)local_1048);
  }
  else {
LAB_001d3799:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1048,(ulong)local_da8);
  }
  local_688 = &local_678;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_678 = *puVar14;
    uStack_670 = puVar9[3];
  }
  else {
    local_678 = *puVar14;
    local_688 = (undefined8 *)*puVar9;
  }
  local_680 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_688);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1018 = *puVar11;
    lStack_1010 = plVar7[3];
    local_1028 = &local_1018;
  }
  else {
    local_1018 = *puVar11;
    local_1028 = (ulong *)*plVar7;
  }
  local_1020 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_dc8 = local_db8;
  std::__cxx11::string::_M_construct((ulong)&local_dc8,'\t');
  uVar17 = 0xf;
  if (local_1028 != &local_1018) {
    uVar17 = local_1018;
  }
  if (uVar17 < (ulong)(local_dc0 + local_1020)) {
    uVar17 = 0xf;
    if (local_dc8 != local_db8) {
      uVar17 = local_db8[0];
    }
    if (uVar17 < (ulong)(local_dc0 + local_1020)) goto LAB_001d38eb;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_dc8,0,(char *)0x0,(ulong)local_1028);
  }
  else {
LAB_001d38eb:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1028,(ulong)local_dc8);
  }
  local_668 = &local_658;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_658 = *puVar14;
    uStack_650 = puVar9[3];
  }
  else {
    local_658 = *puVar14;
    local_668 = (undefined8 *)*puVar9;
  }
  local_660 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_668);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_ff8 = *puVar11;
    lStack_ff0 = plVar7[3];
    local_1008 = &local_ff8;
  }
  else {
    local_ff8 = *puVar11;
    local_1008 = (ulong *)*plVar7;
  }
  local_1000 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_de8 = local_dd8;
  std::__cxx11::string::_M_construct((ulong)&local_de8,'\t');
  uVar17 = 0xf;
  if (local_1008 != &local_ff8) {
    uVar17 = local_ff8;
  }
  if (uVar17 < (ulong)(local_de0 + local_1000)) {
    uVar17 = 0xf;
    if (local_de8 != local_dd8) {
      uVar17 = local_dd8[0];
    }
    if (uVar17 < (ulong)(local_de0 + local_1000)) goto LAB_001d3a3d;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_de8,0,(char *)0x0,(ulong)local_1008);
  }
  else {
LAB_001d3a3d:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1008,(ulong)local_de8);
  }
  local_648 = &local_638;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_638 = *puVar14;
    uStack_630 = puVar9[3];
  }
  else {
    local_638 = *puVar14;
    local_648 = (undefined8 *)*puVar9;
  }
  local_640 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_648);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_fd8 = *puVar11;
    lStack_fd0 = plVar7[3];
    local_fe8 = &local_fd8;
  }
  else {
    local_fd8 = *puVar11;
    local_fe8 = (ulong *)*plVar7;
  }
  local_fe0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e08 = local_df8;
  std::__cxx11::string::_M_construct((ulong)&local_e08,'\f');
  uVar17 = 0xf;
  if (local_fe8 != &local_fd8) {
    uVar17 = local_fd8;
  }
  if (uVar17 < (ulong)(local_e00 + local_fe0)) {
    uVar17 = 0xf;
    if (local_e08 != local_df8) {
      uVar17 = local_df8[0];
    }
    if (uVar17 < (ulong)(local_e00 + local_fe0)) goto LAB_001d3b8f;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e08,0,(char *)0x0,(ulong)local_fe8);
  }
  else {
LAB_001d3b8f:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_fe8,(ulong)local_e08);
  }
  local_628 = &local_618;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_618 = *puVar14;
    uStack_610 = puVar9[3];
  }
  else {
    local_618 = *puVar14;
    local_628 = (undefined8 *)*puVar9;
  }
  local_620 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_628);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_fb8 = *puVar11;
    lStack_fb0 = plVar7[3];
    local_fc8 = &local_fb8;
  }
  else {
    local_fb8 = *puVar11;
    local_fc8 = (ulong *)*plVar7;
  }
  local_fc0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e28 = local_e18;
  std::__cxx11::string::_M_construct((ulong)&local_e28,'\f');
  uVar17 = 0xf;
  if (local_fc8 != &local_fb8) {
    uVar17 = local_fb8;
  }
  if (uVar17 < (ulong)(local_e20 + local_fc0)) {
    uVar17 = 0xf;
    if (local_e28 != local_e18) {
      uVar17 = local_e18[0];
    }
    if (uVar17 < (ulong)(local_e20 + local_fc0)) goto LAB_001d3ce1;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e28,0,(char *)0x0,(ulong)local_fc8);
  }
  else {
LAB_001d3ce1:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_fc8,(ulong)local_e28);
  }
  local_608 = &local_5f8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_5f8 = *puVar14;
    uStack_5f0 = puVar9[3];
  }
  else {
    local_5f8 = *puVar14;
    local_608 = (undefined8 *)*puVar9;
  }
  local_600 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_608);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f98 = *puVar11;
    lStack_f90 = plVar7[3];
    local_fa8 = &local_f98;
  }
  else {
    local_f98 = *puVar11;
    local_fa8 = (ulong *)*plVar7;
  }
  local_fa0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e48 = local_e38;
  std::__cxx11::string::_M_construct((ulong)&local_e48,'\t');
  uVar17 = 0xf;
  if (local_fa8 != &local_f98) {
    uVar17 = local_f98;
  }
  if (uVar17 < (ulong)(local_e40 + local_fa0)) {
    uVar17 = 0xf;
    if (local_e48 != local_e38) {
      uVar17 = local_e38[0];
    }
    if (uVar17 < (ulong)(local_e40 + local_fa0)) goto LAB_001d3e33;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e48,0,(char *)0x0,(ulong)local_fa8);
  }
  else {
LAB_001d3e33:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_fa8,(ulong)local_e48);
  }
  local_5e8 = &local_5d8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_5d8 = *puVar14;
    uStack_5d0 = puVar9[3];
  }
  else {
    local_5d8 = *puVar14;
    local_5e8 = (undefined8 *)*puVar9;
  }
  local_5e0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_5e8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f78 = *puVar11;
    lStack_f70 = plVar7[3];
    local_f88 = &local_f78;
  }
  else {
    local_f78 = *puVar11;
    local_f88 = (ulong *)*plVar7;
  }
  local_f80 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e68 = local_e58;
  std::__cxx11::string::_M_construct((ulong)&local_e68,'\t');
  uVar17 = 0xf;
  if (local_f88 != &local_f78) {
    uVar17 = local_f78;
  }
  if (uVar17 < (ulong)(local_e60 + local_f80)) {
    uVar17 = 0xf;
    if (local_e68 != local_e58) {
      uVar17 = local_e58[0];
    }
    if (uVar17 < (ulong)(local_e60 + local_f80)) goto LAB_001d3f85;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e68,0,(char *)0x0,(ulong)local_f88);
  }
  else {
LAB_001d3f85:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f88,(ulong)local_e68);
  }
  local_5c8 = &local_5b8;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_5b8 = *puVar14;
    uStack_5b0 = puVar9[3];
  }
  else {
    local_5b8 = *puVar14;
    local_5c8 = (undefined8 *)*puVar9;
  }
  local_5c0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_5c8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f58 = *puVar11;
    lStack_f50 = plVar7[3];
    local_f68 = &local_f58;
  }
  else {
    local_f58 = *puVar11;
    local_f68 = (ulong *)*plVar7;
  }
  local_f60 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e88 = local_e78;
  std::__cxx11::string::_M_construct((ulong)&local_e88,'\t');
  uVar17 = 0xf;
  if (local_f68 != &local_f58) {
    uVar17 = local_f58;
  }
  if (uVar17 < (ulong)(local_e80 + local_f60)) {
    uVar17 = 0xf;
    if (local_e88 != local_e78) {
      uVar17 = local_e78[0];
    }
    if (uVar17 < (ulong)(local_e80 + local_f60)) goto LAB_001d40d7;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e88,0,(char *)0x0,(ulong)local_f68);
  }
  else {
LAB_001d40d7:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f68,(ulong)local_e88);
  }
  local_5a8 = &local_598;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_598 = *puVar14;
    uStack_590 = puVar9[3];
  }
  else {
    local_598 = *puVar14;
    local_5a8 = (undefined8 *)*puVar9;
  }
  local_5a0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f38 = *puVar11;
    lStack_f30 = plVar7[3];
    local_f48 = &local_f38;
  }
  else {
    local_f38 = *puVar11;
    local_f48 = (ulong *)*plVar7;
  }
  local_f40 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ea8 = local_e98;
  std::__cxx11::string::_M_construct((ulong)&local_ea8,'\t');
  uVar17 = 0xf;
  if (local_f48 != &local_f38) {
    uVar17 = local_f38;
  }
  if (uVar17 < (ulong)(local_ea0 + local_f40)) {
    uVar17 = 0xf;
    if (local_ea8 != local_e98) {
      uVar17 = local_e98[0];
    }
    if (uVar17 < (ulong)(local_ea0 + local_f40)) goto LAB_001d4229;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ea8,0,(char *)0x0,(ulong)local_f48);
  }
  else {
LAB_001d4229:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f48,(ulong)local_ea8);
  }
  local_588 = &local_578;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_578 = *puVar14;
    uStack_570 = puVar9[3];
  }
  else {
    local_578 = *puVar14;
    local_588 = (undefined8 *)*puVar9;
  }
  local_580 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_588);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_f18 = *puVar11;
    lStack_f10 = plVar7[3];
    local_f28 = &local_f18;
  }
  else {
    local_f18 = *puVar11;
    local_f28 = (ulong *)*plVar7;
  }
  local_f20 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ec8 = local_eb8;
  std::__cxx11::string::_M_construct((ulong)&local_ec8,'\t');
  uVar17 = 0xf;
  if (local_f28 != &local_f18) {
    uVar17 = local_f18;
  }
  if (uVar17 < (ulong)(local_ec0 + local_f20)) {
    uVar17 = 0xf;
    if (local_ec8 != local_eb8) {
      uVar17 = local_eb8[0];
    }
    if (uVar17 < (ulong)(local_ec0 + local_f20)) goto LAB_001d437b;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ec8,0,(char *)0x0,(ulong)local_f28);
  }
  else {
LAB_001d437b:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f28,(ulong)local_ec8);
  }
  local_568 = &local_558;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_558 = *puVar14;
    uStack_550 = puVar9[3];
  }
  else {
    local_558 = *puVar14;
    local_568 = (undefined8 *)*puVar9;
  }
  local_560 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_568);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_14b8 = *puVar11;
    lStack_14b0 = plVar7[3];
    local_14c8 = &local_14b8;
  }
  else {
    local_14b8 = *puVar11;
    local_14c8 = (ulong *)*plVar7;
  }
  local_14c0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_ee8 = local_ed8;
  std::__cxx11::string::_M_construct((ulong)&local_ee8,'\f');
  uVar17 = 0xf;
  if (local_14c8 != &local_14b8) {
    uVar17 = local_14b8;
  }
  if (uVar17 < (ulong)(local_ee0 + local_14c0)) {
    uVar17 = 0xf;
    if (local_ee8 != local_ed8) {
      uVar17 = local_ed8[0];
    }
    if (uVar17 < (ulong)(local_ee0 + local_14c0)) goto LAB_001d44cd;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_ee8,0,(char *)0x0,(ulong)local_14c8);
  }
  else {
LAB_001d44cd:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_14c8,(ulong)local_ee8);
  }
  local_1488 = &local_1478;
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1478 = *puVar11;
    uStack_1470 = puVar9[3];
  }
  else {
    local_1478 = *puVar11;
    local_1488 = (ulong *)*puVar9;
  }
  local_1480 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1488);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_13e0 = *puVar11;
    lStack_13d8 = plVar7[3];
    local_13f0 = &local_13e0;
  }
  else {
    local_13e0 = *puVar11;
    local_13f0 = (ulong *)*plVar7;
  }
  local_13e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_f08 = local_ef8;
  std::__cxx11::string::_M_construct((ulong)&local_f08,'\t');
  uVar17 = 0xf;
  if (local_13f0 != &local_13e0) {
    uVar17 = local_13e0;
  }
  if (uVar17 < (ulong)(local_f00 + local_13e8)) {
    uVar17 = 0xf;
    if (local_f08 != local_ef8) {
      uVar17 = local_ef8[0];
    }
    if (uVar17 < (ulong)(local_f00 + local_13e8)) goto LAB_001d4620;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f08,0,(char *)0x0,(ulong)local_13f0);
  }
  else {
LAB_001d4620:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_13f0,(ulong)local_f08);
  }
  local_1468 = &local_1458;
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1458 = *puVar11;
    uStack_1450 = puVar9[3];
  }
  else {
    local_1458 = *puVar11;
    local_1468 = (ulong *)*puVar9;
  }
  local_1460 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1468);
  local_1428 = &local_1418;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_1418 = *puVar14;
    uStack_1410 = puVar9[3];
  }
  else {
    local_1418 = *puVar14;
    local_1428 = (undefined8 *)*puVar9;
  }
  local_1420 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1428,(ulong)(gridName->_M_dataplus)._M_p);
  local_1448 = &local_1438;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_1438 = *puVar11;
    lStack_1430 = plVar7[3];
  }
  else {
    local_1438 = *puVar11;
    local_1448 = (ulong *)*plVar7;
  }
  local_1440 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1448);
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1518 = *puVar11;
    uStack_1510 = puVar9[3];
    local_1528 = &local_1518;
  }
  else {
    local_1518 = *puVar11;
    local_1528 = (ulong *)*puVar9;
  }
  local_1520 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_508 = local_4f8;
  std::__cxx11::string::_M_construct((ulong)&local_508,'\x06');
  uVar17 = 0xf;
  if (local_1528 != &local_1518) {
    uVar17 = local_1518;
  }
  if (uVar17 < (ulong)(local_500 + local_1520)) {
    uVar17 = 0xf;
    if (local_508 != local_4f8) {
      uVar17 = local_4f8[0];
    }
    if (uVar17 < (ulong)(local_500 + local_1520)) goto LAB_001d4822;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_508,0,(char *)0x0,(ulong)local_1528);
  }
  else {
LAB_001d4822:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1528,(ulong)local_508);
  }
  local_14a8 = &local_1498;
  puVar14 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar14) {
    local_1498 = *puVar14;
    uStack_1490 = puVar9[3];
  }
  else {
    local_1498 = *puVar14;
    local_14a8 = (undefined8 *)*puVar9;
  }
  local_14a0 = puVar9[1];
  *puVar9 = puVar14;
  puVar9[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_14a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_14d8 = *puVar11;
    lStack_14d0 = plVar7[3];
    local_14e8 = &local_14d8;
  }
  else {
    local_14d8 = *puVar11;
    local_14e8 = (ulong *)*plVar7;
  }
  local_14e0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_528 = local_518;
  std::__cxx11::string::_M_construct((ulong)&local_528,'\x06');
  uVar17 = 0xf;
  if (local_14e8 != &local_14d8) {
    uVar17 = local_14d8;
  }
  if (uVar17 < (ulong)(local_520 + local_14e0)) {
    uVar17 = 0xf;
    if (local_528 != local_518) {
      uVar17 = local_518[0];
    }
    if (uVar17 < (ulong)(local_520 + local_14e0)) goto LAB_001d4967;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_528,0,(char *)0x0,(ulong)local_14e8);
  }
  else {
LAB_001d4967:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_14e8,(ulong)local_528);
  }
  local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
  psVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1508.field_2._M_allocated_capacity = *psVar12;
    local_1508.field_2._8_8_ = puVar9[3];
  }
  else {
    local_1508.field_2._M_allocated_capacity = *psVar12;
    local_1508._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_1508._M_string_length = puVar9[1];
  *puVar9 = psVar12;
  puVar9[1] = 0;
  *(undefined1 *)psVar12 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1508);
  puVar11 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar11) {
    local_1540 = *puVar11;
    uStack_1538 = puVar9[3];
    local_1550 = &local_1540;
  }
  else {
    local_1540 = *puVar11;
    local_1550 = (ulong *)*puVar9;
  }
  local_1548 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_548 = local_538;
  std::__cxx11::string::_M_construct((ulong)&local_548,'\x06');
  uVar17 = 0xf;
  if (local_1550 != &local_1540) {
    uVar17 = local_1540;
  }
  if (uVar17 < (ulong)(local_540 + local_1548)) {
    uVar17 = 0xf;
    if (local_548 != local_538) {
      uVar17 = local_538[0];
    }
    if (uVar17 < (ulong)(local_540 + local_1548)) goto LAB_001d4a93;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_548,0,(char *)0x0,(ulong)local_1550);
  }
  else {
LAB_001d4a93:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1550,(ulong)local_548);
  }
  local_3c0 = (char *)&local_3b0;
  pcVar15 = (char *)(puVar9 + 2);
  if ((char *)*puVar9 == pcVar15) {
    local_3b0 = *(undefined8 *)pcVar15;
    uStack_3a8 = puVar9[3];
  }
  else {
    local_3b0 = *(undefined8 *)pcVar15;
    local_3c0 = (char *)*puVar9;
  }
  local_3b8 = puVar9[1];
  *puVar9 = pcVar15;
  puVar9[1] = 0;
  *pcVar15 = '\0';
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  (local_1530->_M_dataplus)._M_p = (pointer)&local_1530->field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    lVar3 = plVar7[3];
    (local_1530->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&local_1530->field_2 + 8) = lVar3;
  }
  else {
    (local_1530->_M_dataplus)._M_p = (pointer)*plVar7;
    (local_1530->field_2)._M_allocated_capacity = *psVar12;
  }
  local_1530->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_3c0 != (char *)&local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_548 != local_538) {
    operator_delete(local_548);
  }
  if (local_1550 != &local_1540) {
    operator_delete(local_1550);
  }
  psVar18 = local_1530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
    operator_delete(local_1508._M_dataplus._M_p);
  }
  if (local_528 != local_518) {
    operator_delete(local_528);
  }
  if (local_14e8 != &local_14d8) {
    operator_delete(local_14e8);
  }
  if (local_14a8 != &local_1498) {
    operator_delete(local_14a8);
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508);
  }
  if (local_1528 != &local_1518) {
    operator_delete(local_1528);
  }
  if (local_1448 != &local_1438) {
    operator_delete(local_1448);
  }
  if (local_1428 != &local_1418) {
    operator_delete(local_1428);
  }
  if (local_1468 != &local_1458) {
    operator_delete(local_1468);
  }
  if (local_f08 != local_ef8) {
    operator_delete(local_f08);
  }
  if (local_13f0 != &local_13e0) {
    operator_delete(local_13f0);
  }
  if (local_1488 != &local_1478) {
    operator_delete(local_1488);
  }
  if (local_ee8 != local_ed8) {
    operator_delete(local_ee8);
  }
  if (local_14c8 != &local_14b8) {
    operator_delete(local_14c8);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568);
  }
  if (local_ec8 != local_eb8) {
    operator_delete(local_ec8);
  }
  if (local_f28 != &local_f18) {
    operator_delete(local_f28);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588);
  }
  if (local_ea8 != local_e98) {
    operator_delete(local_ea8);
  }
  if (local_f48 != &local_f38) {
    operator_delete(local_f48);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8);
  }
  if (local_e88 != local_e78) {
    operator_delete(local_e88);
  }
  if (local_f68 != &local_f58) {
    operator_delete(local_f68);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8);
  }
  if (local_e68 != local_e58) {
    operator_delete(local_e68);
  }
  if (local_f88 != &local_f78) {
    operator_delete(local_f88);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8);
  }
  if (local_e48 != local_e38) {
    operator_delete(local_e48);
  }
  if (local_fa8 != &local_f98) {
    operator_delete(local_fa8);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608);
  }
  if (local_e28 != local_e18) {
    operator_delete(local_e28);
  }
  if (local_fc8 != &local_fb8) {
    operator_delete(local_fc8);
  }
  if (local_628 != &local_618) {
    operator_delete(local_628);
  }
  if (local_e08 != local_df8) {
    operator_delete(local_e08);
  }
  if (local_fe8 != &local_fd8) {
    operator_delete(local_fe8);
  }
  if (local_648 != &local_638) {
    operator_delete(local_648);
  }
  if (local_de8 != local_dd8) {
    operator_delete(local_de8);
  }
  if (local_1008 != &local_ff8) {
    operator_delete(local_1008);
  }
  if (local_668 != &local_658) {
    operator_delete(local_668);
  }
  if (local_dc8 != local_db8) {
    operator_delete(local_dc8);
  }
  if (local_1028 != &local_1018) {
    operator_delete(local_1028);
  }
  if (local_688 != &local_678) {
    operator_delete(local_688);
  }
  if (local_da8 != local_d98) {
    operator_delete(local_da8);
  }
  if (local_1048 != &local_1038) {
    operator_delete(local_1048);
  }
  if (local_6a8 != &local_698) {
    operator_delete(local_6a8);
  }
  if (local_d88 != local_d78) {
    operator_delete(local_d88);
  }
  if (local_1068 != &local_1058) {
    operator_delete(local_1068);
  }
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8);
  }
  if (local_d68 != local_d58) {
    operator_delete(local_d68);
  }
  if (local_1088 != &local_1078) {
    operator_delete(local_1088);
  }
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8);
  }
  if (local_d48 != local_d38) {
    operator_delete(local_d48);
  }
  if (local_10a8 != &local_1098) {
    operator_delete(local_10a8);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_708 != &local_6f8) {
    operator_delete(local_708);
  }
  if (local_d28 != local_d18) {
    operator_delete(local_d28);
  }
  if (local_10c8 != &local_10b8) {
    operator_delete(local_10c8);
  }
  if (local_728 != &local_718) {
    operator_delete(local_728);
  }
  if (local_d08 != local_cf8) {
    operator_delete(local_d08);
  }
  if (local_10e8 != &local_10d8) {
    operator_delete(local_10e8);
  }
  if (local_748 != &local_738) {
    operator_delete(local_748);
  }
  if (local_ce8 != local_cd8) {
    operator_delete(local_ce8);
  }
  if (local_1108 != &local_10f8) {
    operator_delete(local_1108);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768);
  }
  if (local_cc8 != local_cb8) {
    operator_delete(local_cc8);
  }
  if (local_1128 != &local_1118) {
    operator_delete(local_1128);
  }
  if (local_788 != &local_778) {
    operator_delete(local_788);
  }
  if (local_ca8 != local_c98) {
    operator_delete(local_ca8);
  }
  if (local_1148 != &local_1138) {
    operator_delete(local_1148);
  }
  if (local_7a8 != &local_798) {
    operator_delete(local_7a8);
  }
  if (local_c88 != local_c78) {
    operator_delete(local_c88);
  }
  if (local_1168 != &local_1158) {
    operator_delete(local_1168);
  }
  if (local_7c8 != &local_7b8) {
    operator_delete(local_7c8);
  }
  if (local_c68 != local_c58) {
    operator_delete(local_c68);
  }
  if (local_1188 != &local_1178) {
    operator_delete(local_1188);
  }
  if (local_7e8 != &local_7d8) {
    operator_delete(local_7e8);
  }
  if (local_c48 != local_c38) {
    operator_delete(local_c48);
  }
  if (local_11a8 != &local_1198) {
    operator_delete(local_11a8);
  }
  if (local_808 != &local_7f8) {
    operator_delete(local_808);
  }
  if (local_c28 != local_c18) {
    operator_delete(local_c28);
  }
  if (local_11c8 != &local_11b8) {
    operator_delete(local_11c8);
  }
  if (local_828 != &local_818) {
    operator_delete(local_828);
  }
  if (local_c08 != local_bf8) {
    operator_delete(local_c08);
  }
  if (local_11e8 != &local_11d8) {
    operator_delete(local_11e8);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  if (local_be8 != local_bd8) {
    operator_delete(local_be8);
  }
  if (local_1208 != &local_11f8) {
    operator_delete(local_1208);
  }
  if (local_868 != &local_858) {
    operator_delete(local_868);
  }
  if (local_bc8 != local_bb8) {
    operator_delete(local_bc8);
  }
  if (local_1228 != &local_1218) {
    operator_delete(local_1228);
  }
  if (local_888 != &local_878) {
    operator_delete(local_888);
  }
  if (local_ba8 != local_b98) {
    operator_delete(local_ba8);
  }
  if (local_1248 != &local_1238) {
    operator_delete(local_1248);
  }
  if (local_8a8 != &local_898) {
    operator_delete(local_8a8);
  }
  if (local_b88 != local_b78) {
    operator_delete(local_b88);
  }
  if (local_1268 != &local_1258) {
    operator_delete(local_1268);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8);
  }
  if (local_b68 != local_b58) {
    operator_delete(local_b68);
  }
  if (local_1288 != &local_1278) {
    operator_delete(local_1288);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8);
  }
  if (local_b48 != local_b38) {
    operator_delete(local_b48);
  }
  if (local_12a8 != &local_1298) {
    operator_delete(local_12a8);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908);
  }
  if (local_b28 != local_b18) {
    operator_delete(local_b28);
  }
  if (local_12c8 != &local_12b8) {
    operator_delete(local_12c8);
  }
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  if (local_b08 != local_af8) {
    operator_delete(local_b08);
  }
  if (local_12e8 != &local_12d8) {
    operator_delete(local_12e8);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  if (local_ae8 != local_ad8) {
    operator_delete(local_ae8);
  }
  if (local_1308 != &local_12f8) {
    operator_delete(local_1308);
  }
  if (local_968 != &local_958) {
    operator_delete(local_968);
  }
  if (local_ac8 != local_ab8) {
    operator_delete(local_ac8);
  }
  if (local_1328 != &local_1318) {
    operator_delete(local_1328);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988);
  }
  if (local_aa8 != local_a98) {
    operator_delete(local_aa8);
  }
  if (local_1348 != &local_1338) {
    operator_delete(local_1348);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8);
  }
  if (local_a88 != local_a78) {
    operator_delete(local_a88);
  }
  if (local_1368 != &local_1358) {
    operator_delete(local_1368);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8);
  }
  if (local_a68 != local_a58) {
    operator_delete(local_a68);
  }
  if (local_1388 != &local_1378) {
    operator_delete(local_1388);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8);
  }
  if (local_a48 != local_a38) {
    operator_delete(local_a48);
  }
  if (local_13a8 != &local_1398) {
    operator_delete(local_13a8);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08);
  }
  if (local_a28 != local_a18) {
    operator_delete(local_a28);
  }
  if (local_13c8 != &local_13b8) {
    operator_delete(local_13c8);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0]);
  }
LAB_001d62af:
  std::ifstream::~ifstream(local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1408);
  return psVar18;
}

Assistant:

std::string KMeans::genClusterInitialization(const std::string& gridName)
{
    std::vector<std::string> initList;

    /* Load the cluster initialization file into an input stream. */
    ifstream input(multifaq::dir::PATH_TO_FILES + "/cluster_init.conf");

    std::cout << "INFO: Looking for cluster initialization file: " << multifaq::dir::PATH_TO_FILES + "/cluster_init.conf" << std::endl;

    if (!input)
    {
        std::cout << "INFO: No cluster initialization file provided. \n";
        std::cout << "INFO: We will use Kmeans++ Initialization instead. \n";
        
        return offset(2)+"// Initialize the means\n\n"+
            offset(2)+"std::srand (time(NULL));\n\n"+
	  offset(2)+"double randomVal = (double)(rand() % (size_t)size_of_query_result);\n"+
	  offset(2)+"double count = 0.0;\n"+
	  offset(2)+"size_t pos = 0;\n"+
	  offset(2)+"while (randomVal < count)\n"+
	  offset(2)+"{\n"+
	  offset(3)+"count += "+gridName+"[pos].aggregates[0];\n"+
	  offset(3)+"++pos;\n"+
	  offset(2)+"}\n"+
	  offset(2)+"means[0] = "+gridName+"[pos];\n"+
            // offset(2)+"means[0] = "+gridName+"[rand() % grid_size];\n\n"+
            offset(2)+"std::vector<double> distribution(grid_size,0.0);\n"+
            offset(2)+"for (size_t i = 1; i < k; ++i)\n"+offset(2)+"{\n"+
            offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n"+
            offset(3)+"double dist_sum = 0.0;\n"+
	  offset(3)+"#pragma omp parallel for num_threads(32) private(min_dist,dist) shared(distribution) reduction(+:dist_sum)\n"+
            offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
            offset(4)+"for (size_t cluster = 0; cluster < i; ++cluster)\n"+
            offset(4)+"{\n"+
            offset(5)+"distance(dist, "+gridName+
            "[tup], means[cluster], cluster, &distance_to_mean[0]);\n"+
            offset(5)+"min_dist = std::min(dist, min_dist);\n"+
            offset(4)+"}\n"+
            offset(4)+"min_dist *= "+gridName+"[tup].aggregates[0];\n"+
            offset(4)+"distribution[tup] = min_dist;\n"+
            offset(4)+"dist_sum += min_dist;\n"+
            offset(3)+"}\n"+
            offset(3)+"distribution[0] /= dist_sum;\n"+
            offset(3)+"for (size_t tup = 1; tup < grid_size; ++tup)\n"+
            offset(3)+"{\n"+
            offset(4)+"distribution[tup] /= dist_sum;\n"+
            offset(4)+"distribution[tup] += distribution[tup-1];\n"+
            offset(3)+"}\n\n"+
            offset(3)+"// Sample a point...\n"+
            offset(3)+"const double sampleValue = ((double) rand() / (RAND_MAX));\n"+
            offset(3)+"size_t pos = 0;\n"+
            offset(3)+"while (distribution[pos] < sampleValue)\n"+
            offset(4)+"pos++;\n"+
            offset(3)+"means[i] = "+gridName+"[pos];\n"+
            offset(2)+"}\n"+
	  offset(2)+"int64_t endInit = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count()-startProcess;\n"+
	  offset(2)+"startProcess = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();\n";
    }
    else
    {
        /* String and associated stream to receive lines from the file. */
        string line;
        stringstream ssLine;

        while (std::getline(input, line))
        {
            if (line[0] == COMMENT_CHAR)
            {
                continue;
            }
            initList.push_back(line+"\n");
        }
    }

    std::string returnString = offset(2)+"// Initialize the means\n";
    
    for (size_t str = 0; str < std::min(initList.size(), _k); ++str)
    {
        returnString += offset(2)+"means["+std::to_string(str)+"] = "+
            initList[str];
    }
    
    if (initList.size() < _k)
    {
        returnString += offset(2)+"for (size_t cluster = "+
            std::to_string(initList.size())+"; cluster < k; ++cluster)\n"+
            offset(3)+"means[cluster] += "+gridName+"[rand() % "+
            gridName+".size()];\n\n";
    }
    
    return returnString;
}